

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_A_ExtChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  FState *meleestate;
  AActor *actor;
  char *pcVar5;
  FState *missilestate;
  bool bVar6;
  bool nightmarefast;
  PClass *pPVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0052489f;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0052488f:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0052489f:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xaf9,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  actor = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (actor == (AActor *)0x0) goto LAB_005247a7;
    pPVar4 = (actor->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(actor->super_DThinker).super_DObject._vptr_DObject)();
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (actor->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar6 = pPVar4 != (PClass *)0x0;
    if (pPVar4 != pPVar2 && bVar6) {
      do {
        pPVar4 = pPVar4->ParentClass;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 == pPVar2) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    if (!bVar6) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0052489f;
    }
  }
  else {
    if (actor != (AActor *)0x0) goto LAB_0052488f;
LAB_005247a7:
    actor = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_005248c7:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafa,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_005248c7;
  }
  if (numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
LAB_005248ef:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xafb,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_005248ef;
  }
  if (numparam == 3) {
    bVar6 = true;
  }
  else {
    VVar1 = param[3].field_0.field_3.Type;
    if (VVar1 == '\0') {
      bVar6 = param[3].field_0.i != 0;
    }
    else {
      bVar6 = true;
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xafc,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    if (4 < (uint)numparam) {
      VVar1 = param[4].field_0.field_3.Type;
      if (VVar1 == '\0') {
        nightmarefast = param[4].field_0.i != 0;
        goto LAB_00524838;
      }
      if (VVar1 != 0xff) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                      ,0xafd,"int AF_A_ExtChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
  }
  nightmarefast = false;
LAB_00524838:
  if (param[1].field_0.i == 0) {
    meleestate = (FState *)0x0;
  }
  else {
    meleestate = actor->MeleeState;
  }
  if (param[2].field_0.i == 0) {
    missilestate = (FState *)0x0;
  }
  else {
    missilestate = actor->MissileState;
  }
  A_DoChase((VMFrameStack *)0x0,actor,false,meleestate,missilestate,bVar6,nightmarefast,false,0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ExtChase)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL		(domelee);
	PARAM_BOOL		(domissile);
	PARAM_BOOL_OPT	(playactive)	{ playactive = true; }
	PARAM_BOOL_OPT	(nightmarefast)	{ nightmarefast = false; }

	// Now that A_Chase can handle state label parameters, this function has become rather useless...
	A_DoChase(stack, self, false,
		domelee ? self->MeleeState : NULL, domissile ? self->MissileState : NULL,
		playactive, nightmarefast, false, 0);
	return 0;
}